

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFF_Layer3.cpp
# Opt level: O0

void __thiscall KDIS::DATA_TYPE::IFF_Layer3::ClearDataRecords(IFF_Layer3 *this)

{
  IFF_Layer3 *this_local;
  
  (this->super_LayerHeader).m_ui16LayerLength = 0x1c;
  std::
  vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>_>_>
  ::clear(&this->m_vStdVarRecs);
  this->m_ui16NumIffRecs = 0;
  return;
}

Assistant:

void IFF_Layer3::ClearDataRecords()
{
	// Reset the length.
	m_ui16LayerLength = IFF_LAYER3_SIZE;

    m_vStdVarRecs.clear();
    m_ui16NumIffRecs = 0;
}